

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> * __thiscall
llvm::yaml::Input::keys
          (vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__return_storage_ptr__,
          Input *this)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  HNode *hnode;
  ret_type pMVar3;
  Child local_48;
  size_t local_40;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
  local_30;
  iterator __begin1;
  
  pMVar3 = dyn_cast<llvm::yaml::Input::MapHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pMVar3 == (ret_type)0x0) {
    hnode = this->CurrentNode;
    Twine::Twine((Twine *)&local_48,"not a mapping");
    setError(this,hnode,(Twine *)&local_48);
  }
  else {
    local_30.Ptr = (StringMapEntryBase **)
                   StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                   ::begin(&pMVar3->Mapping);
    uVar1 = (pMVar3->Mapping).super_StringMapImpl.NumBuckets;
    ppSVar2 = (pMVar3->Mapping).super_StringMapImpl.TheTable;
    while (local_30.Ptr != ppSVar2 + uVar1) {
      local_40 = (*local_30.Ptr)->StrLen;
      local_48.decUL = &(*local_30.Ptr)[2].StrLen;
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
                (__return_storage_ptr__,(StringRef *)&local_48);
      StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
      ::operator++(&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<StringRef> Input::keys() {
  MapHNode *MN = dyn_cast<MapHNode>(CurrentNode);
  std::vector<StringRef> Ret;
  if (!MN) {
    setError(CurrentNode, "not a mapping");
    return Ret;
  }
  for (auto &P : MN->Mapping)
    Ret.push_back(P.first());
  return Ret;
}